

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_process_willingness_tlv
               (uint8_t *mprtypes,size_t mprtypes_size,rfc5444_reader_tlvblock_entry *tlv)

{
  nhdp_domain *pnVar1;
  ulong uVar2;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  ulong uStack_58;
  uint8_t value;
  size_t i;
  size_t idx;
  nhdp_domain *domain;
  rfc5444_reader_tlvblock_entry *tlv_local;
  size_t mprtypes_size_local;
  uint8_t *mprtypes_local;
  
  _flooding_domain._tmp_willingness = '\0';
  for (idx = (size_t)(_domain_list.next + -0x2a);
      *(list_entity **)(idx + 0x2a8) != _domain_list.prev; idx = *(long *)(idx + 0x2a0) - 0x2a0) {
    *(undefined1 *)(idx + 0x39) = 0;
  }
  if (tlv != (rfc5444_reader_tlvblock_entry *)0x0) {
    _flooding_domain._tmp_willingness = *tlv->single_value & 0xf;
    if (((&log_global_mask)[LOG_NHDP_R] & 1) != 0) {
      oonf_log(1,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2c4,0,0,
               "Received flooding willingness: %u",_flooding_domain._tmp_willingness);
    }
    for (uStack_58 = 0; uStack_58 < mprtypes_size; uStack_58 = uStack_58 + 1) {
      pnVar1 = nhdp_domain_get_by_ext(mprtypes[uStack_58]);
      if ((pnVar1 != (nhdp_domain *)0x0) && (uVar2 = uStack_58 + 1 >> 1, uVar2 < tlv->length)) {
        if ((pnVar1->index & 1U) == 0) {
          __tempptr._7_1_ = (byte)((int)(uint)tlv->single_value[uVar2] >> 4);
        }
        else {
          __tempptr._7_1_ = tlv->single_value[uVar2] & 0xf;
        }
        pnVar1->_tmp_willingness = __tempptr._7_1_;
        if (((&log_global_mask)[LOG_NHDP_R] & 1) != 0) {
          oonf_log(1,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2db,0,0,
                   "Received routing willingness for domain %u: %u",pnVar1->ext,
                   pnVar1->_tmp_willingness);
        }
      }
    }
  }
  return;
}

Assistant:

void
nhdp_domain_process_willingness_tlv(
  uint8_t *mprtypes, size_t mprtypes_size, struct rfc5444_reader_tlvblock_entry *tlv) {
  struct nhdp_domain *domain;
  size_t idx, i;
  uint8_t value;

  _flooding_domain._tmp_willingness = RFC7181_WILLINGNESS_NEVER;
  list_for_each_element(&_domain_list, domain, _node) {
    domain->_tmp_willingness = RFC7181_WILLINGNESS_NEVER;
  }

  if (!tlv) {
    return;
  }

  /* copy flooding willingness */
  _flooding_domain._tmp_willingness = tlv->single_value[0] & RFC7181_WILLINGNESS_MASK;
  OONF_DEBUG(LOG_NHDP_R, "Received flooding willingness: %u", _flooding_domain._tmp_willingness);

  for (i = 0; i < mprtypes_size; i++) {
    domain = nhdp_domain_get_by_ext(mprtypes[i]);
    if (domain == NULL) {
      continue;
    }

    idx = (i + 1) / 2;
    if (idx >= tlv->length) {
      continue;
    }

    value = tlv->single_value[idx];
    if ((domain->index & 1) == 0) {
      value >>= RFC7181_WILLINGNESS_SHIFT;
    }
    else {
      value &= RFC7181_WILLINGNESS_MASK;
    }

    domain->_tmp_willingness = value;

    OONF_DEBUG(LOG_NHDP_R, "Received routing willingness for domain %u: %u", domain->ext, domain->_tmp_willingness);
  }
}